

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O1

void apply_explicit_binding
               (_mesa_glsl_parse_state *state,YYLTYPE *loc,ir_variable *var,glsl_type *type,
               ast_type_qualifier *qual)

{
  undefined1 *puVar1;
  gl_context *pgVar2;
  bool bVar3;
  uint uVar4;
  undefined8 in_RAX;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  glsl_type *t;
  uint qual_binding;
  undefined8 uStack_38;
  
  if ((undefined1  [12])((undefined1  [12])qual->flags & (undefined1  [12])0xc00) ==
      (undefined1  [12])0x0) {
    _mesa_glsl_error(loc,state,
                     "the \"binding\" qualifier only applies to uniforms and shader storage buffer objects"
                    );
    return;
  }
  uStack_38 = in_RAX;
  bVar3 = process_qualifier_constant
                    (state,loc,"binding",qual->binding,(uint *)((long)&uStack_38 + 4));
  if (!bVar3) {
    return;
  }
  pgVar2 = state->ctx;
  uVar4 = 1;
  if (type->field_0x4 == '\x11') {
    uVar4 = glsl_type::arrays_of_arrays_size(type);
  }
  for (; type->field_0x4 == '\x11'; type = (glsl_type *)(type->fields).parameters) {
  }
  uVar7 = (uVar4 + uStack_38._4_4_) - 1;
  if (type->field_0x4 == '\f') {
    if (uVar7 < (pgVar2->Const).MaxCombinedTextureImageUnits) goto LAB_0019d210;
    pcVar6 = 
    "layout(binding = %d) for %d samplers exceeds the maximum number of texture image units (%u)";
  }
  else {
    if (type->field_0x4 != '\x10') {
      uVar4 = glsl_type::atomic_size(type);
      if (uVar4 == 0) {
        uVar4 = state->forced_language_version;
        if (uVar4 == 0) {
          uVar4 = state->language_version;
        }
        uVar5 = 0x1a3;
        if (state->es_shader != false) {
          uVar5 = 0x135;
        }
        if (((uVar4 <= uVar5) && (state->ARB_shading_language_420pack_enable != true)) ||
           (type->field_0x4 != '\r')) {
          _mesa_glsl_error(loc,state,
                           "the \"binding\" qualifier only applies to uniform blocks, storage blocks, opaque variables, or arrays thereof"
                          );
          return;
        }
        uVar4 = (pgVar2->Const).MaxImageUnits;
        if (0xc0 < uVar4) {
          __assert_fail("ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                        ,0xb9a,
                        "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                       );
        }
        if (uVar4 <= uVar7) {
          pcVar6 = "Image binding %d exceeds the maximum number of image units (%d)";
          goto LAB_0019d297;
        }
      }
      else {
        uVar4 = (pgVar2->Const).MaxAtomicBufferBindings;
        if (0x5a < uVar4) {
          __assert_fail("ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                        ,0xb8e,
                        "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                       );
        }
        if (uVar4 <= uStack_38._4_4_) {
          pcVar6 = 
          "layout(binding = %d) exceeds the maximum number of atomic counter buffer bindings (%u)";
          uVar7 = uStack_38._4_4_;
LAB_0019d297:
          _mesa_glsl_error(loc,state,pcVar6,(ulong)uVar7);
          return;
        }
      }
LAB_0019d210:
      puVar1 = &(var->data).field_0x2;
      *puVar1 = *puVar1 | 0x10;
      (var->data).binding = uStack_38._4_2_;
      return;
    }
    uVar5 = (uint)*(undefined8 *)&qual->flags;
    if (((uVar5 >> 10 & 1) == 0) || (uVar7 < (pgVar2->Const).MaxUniformBufferBindings)) {
      if (((uVar5 >> 0xb & 1) == 0) || (uVar7 < (pgVar2->Const).MaxShaderStorageBufferBindings))
      goto LAB_0019d210;
      pcVar6 = 
      "layout(binding = %u) for %d SSBOs exceeds the maximum number of SSBO binding points (%d)";
    }
    else {
      pcVar6 = 
      "layout(binding = %u) for %d UBOs exceeds the maximum number of UBO binding points (%d)";
    }
  }
  _mesa_glsl_error(loc,state,pcVar6,(ulong)uStack_38._4_4_,(ulong)uVar4);
  return;
}

Assistant:

static void
apply_explicit_binding(struct _mesa_glsl_parse_state *state,
                       YYLTYPE *loc,
                       ir_variable *var,
                       const glsl_type *type,
                       const ast_type_qualifier *qual)
{
   if (!qual->flags.q.uniform && !qual->flags.q.buffer) {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniforms and "
                       "shader storage buffer objects");
      return;
   }

   unsigned qual_binding;
   if (!process_qualifier_constant(state, loc, "binding", qual->binding,
                                   &qual_binding)) {
      return;
   }

   const struct gl_context *const ctx = state->ctx;
   unsigned elements = type->is_array() ? type->arrays_of_arrays_size() : 1;
   unsigned max_index = qual_binding + elements - 1;
   const glsl_type *base_type = type->without_array();

   if (base_type->is_interface()) {
      /* UBOs.  From page 60 of the GLSL 4.20 specification:
       * "If the binding point for any uniform block instance is less than zero,
       *  or greater than or equal to the implementation-dependent maximum
       *  number of uniform buffer bindings, a compilation error will occur.
       *  When the binding identifier is used with a uniform block instanced as
       *  an array of size N, all elements of the array from binding through
       *  binding + N – 1 must be within this range."
       *
       * The implementation-dependent maximum is GL_MAX_UNIFORM_BUFFER_BINDINGS.
       */
      if (qual->flags.q.uniform &&
         max_index >= ctx->Const.MaxUniformBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d UBOs exceeds "
                          "the maximum number of UBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxUniformBufferBindings);
         return;
      }

      /* SSBOs. From page 67 of the GLSL 4.30 specification:
       * "If the binding point for any uniform or shader storage block instance
       *  is less than zero, or greater than or equal to the
       *  implementation-dependent maximum number of uniform buffer bindings, a
       *  compile-time error will occur. When the binding identifier is used
       *  with a uniform or shader storage block instanced as an array of size
       *  N, all elements of the array from binding through binding + N – 1 must
       *  be within this range."
       */
      if (qual->flags.q.buffer &&
         max_index >= ctx->Const.MaxShaderStorageBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d SSBOs exceeds "
                          "the maximum number of SSBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxShaderStorageBufferBindings);
         return;
      }
   } else if (base_type->is_sampler()) {
      /* Samplers.  From page 63 of the GLSL 4.20 specification:
       * "If the binding is less than zero, or greater than or equal to the
       *  implementation-dependent maximum supported number of units, a
       *  compilation error will occur. When the binding identifier is used
       *  with an array of size N, all elements of the array from binding
       *  through binding + N - 1 must be within this range."
       */
      unsigned limit = ctx->Const.MaxCombinedTextureImageUnits;

      if (max_index >= limit) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) for %d samplers "
                          "exceeds the maximum number of texture image units "
                          "(%u)", qual_binding, elements, limit);

         return;
      }
   } else if (base_type->contains_atomic()) {
      assert(ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS);
      if (qual_binding >= ctx->Const.MaxAtomicBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) exceeds the "
                          "maximum number of atomic counter buffer bindings "
                          "(%u)", qual_binding,
                          ctx->Const.MaxAtomicBufferBindings);

         return;
      }
   } else if ((state->is_version(420, 310) ||
               state->ARB_shading_language_420pack_enable) &&
              base_type->is_image()) {
      assert(ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS);
      if (max_index >= ctx->Const.MaxImageUnits) {
         _mesa_glsl_error(loc, state, "Image binding %d exceeds the "
                          "maximum number of image units (%d)", max_index,
                          ctx->Const.MaxImageUnits);
         return;
      }

   } else {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniform "
                       "blocks, storage blocks, opaque variables, or arrays "
                       "thereof");
      return;
   }

   var->data.explicit_binding = true;
   var->data.binding = qual_binding;

   return;
}